

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  bool verbose;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t iterations;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM0 [64];
  long local_40;
  
  uVar8 = 100000;
  uVar7 = 0;
  verbose = false;
  local_40 = 1;
  while( true ) {
    while( true ) {
      iVar3 = getopt(argc,argv,"vhm:n:i:");
      auVar10 = in_ZMM0._0_16_;
      if (iVar3 != 0x69) break;
      iVar3 = atoi(_optarg);
      uVar7 = (ulong)iVar3;
    }
    if (iVar3 < 0x6d) break;
    if (iVar3 == 0x6d) {
      local_40 = atoll(_optarg);
    }
    else if (iVar3 == 0x76) {
      verbose = true;
    }
    else {
      if (iVar3 != 0x6e) goto LAB_001129e7;
      uVar8 = atoll(_optarg);
    }
  }
  if (iVar3 == -1) {
    if (uVar8 >> 0x20 != 0) {
      printf("setting n to %u \n",0xffffffff);
      uVar8 = 0xffffffff;
    }
    uVar6 = uVar8 * local_40;
    if (uVar7 >> 0x20 == 0) {
      uVar9 = 10;
      if (uVar6 < 1000000) {
        uVar9 = 100;
      }
      if (uVar7 != 0) {
        uVar9 = uVar7;
      }
    }
    else {
      printf("setting iterations to %u \n",0xffffffff);
      uVar9 = 0xffffffff;
    }
    printf("n = %zu m = %zu \n",uVar8,local_40);
    printf("iterations = %zu \n",uVar9);
    if (uVar8 == 0) {
      iVar3 = 1;
      pcVar5 = "n cannot be zero.";
    }
    else {
      uVar7 = uVar6 * 2;
      if (uVar7 < 0x400) {
        printf("array size: %zu B\n");
      }
      else {
        auVar10 = vcvtusi2sd_avx512f(auVar10,uVar7);
        if (uVar7 < 0x100000) {
          dVar1 = 0.0009765625;
          pcVar5 = "array size: %.3f kB\n";
        }
        else {
          dVar1 = 9.5367431640625e-07;
          pcVar5 = "array size: %.3f MB\n";
        }
        printf(pcVar5,auVar10._0_8_ * dVar1);
      }
      iterations = (uint32_t)uVar9;
      measurepopcnt((uint32_t)uVar6,iterations,verbose);
      measureoverhead((uint32_t)uVar6,iterations,verbose);
      lVar4 = 0;
      do {
        while( true ) {
          pcVar5 = pospopcnt_u16_method_names[lVar4];
          printf("%-40s\t",pcVar5);
          fflush((FILE *)0x0);
          bVar2 = benchmarkMany((uint32_t)uVar8,(uint32_t)local_40,iterations,
                                pospopcnt_u16_methods[lVar4],verbose,true);
          if (!bVar2) {
            printf("Problem detected with %s.\n",pcVar5);
          }
          if (!verbose) break;
          putchar(10);
          lVar4 = lVar4 + 1;
          if (lVar4 == 0x26) {
            return 0;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x26);
      pcVar5 = "Try -v to get more details.";
      iVar3 = 0;
    }
LAB_001129cd:
    puts(pcVar5);
    return iVar3;
  }
  if (iVar3 == 0x68) {
    iVar3 = 0;
    printf(" Try %s -n 100000 -i 15 -v \n",*argv);
    puts("-n is the number of 16-bit words ");
    puts("-i is the number of tests or iterations ");
    pcVar5 = "-v makes things verbose";
    goto LAB_001129cd;
  }
LAB_001129e7:
  abort();
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    int c;

    while ((c = getopt(argc, argv, "vhm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    printf("n = %zu m = %zu \n", n, m);
    printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    if(array_in_bytes < 1024) {
      printf("array size: %zu B\n", array_in_bytes);
    } else if (array_in_bytes < 1024 * 1024) {
      printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    } else {
      printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    }

#if POSPOPCNT_SIMD_VERSION >= 5
    measurepopcnt(n*m, iterations, verbose);
#endif
    measureoverhead(n*m, iterations, verbose);
   
    for (size_t k = 0; k < PPOPCNT_NUMBER_METHODS; k++) {
        printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(n, m, iterations, pospopcnt_u16_methods[k], verbose, true);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        if (verbose)
            printf("\n");
    }

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}